

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenuBar(void)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  ImVec2 IVar2;
  bool bVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImRect IVar8;
  ImRect local_28;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if ((this->SkipItems == false) && ((this->Flags & 0x400) != 0)) {
    BeginGroup();
    PushID("##menubar");
    IVar8 = ImGuiWindow::MenuBarRect(this);
    fVar5 = IVar8.Min.x;
    fVar6 = this->WindowBorderSize;
    uVar4 = -(uint)(fVar6 <= this->WindowRounding);
    fVar7 = IVar8.Max.x - (float)(~uVar4 & (uint)fVar6 | (uint)this->WindowRounding & uVar4);
    uVar4 = -(uint)(fVar7 <= fVar5);
    local_28.Min.x = (float)(int)(fVar6 + fVar5 + 0.5);
    local_28.Min.y = (float)(int)(fVar6 + IVar8.Min.y + 0.5);
    local_28.Max.x = (float)(int)((float)(uVar4 & (uint)fVar5 | ~uVar4 & (uint)fVar7) + 0.5);
    local_28.Max.y = (float)(int)(IVar8.Max.y + 0.5);
    ImRect::ClipWith(&local_28,&this->OuterRectClipped);
    PushClipRect(&local_28.Min,&local_28.Max,false);
    IVar1 = (this->DC).MenuBarOffset;
    fVar5 = IVar1.x + fVar5;
    fVar6 = IVar1.y + IVar8.Min.y;
    IVar1.y = fVar6;
    IVar1.x = fVar5;
    (this->DC).CursorMaxPos = IVar1;
    IVar2.y = fVar6;
    IVar2.x = fVar5;
    (this->DC).CursorPos = IVar2;
    (this->DC).LayoutType = 0;
    (this->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
    (this->DC).MenuBarAppending = true;
    AlignTextToFramePadding();
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}